

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::IgnoreErrorsCMP0061(cmMakefile *this)

{
  PolicyStatus PVar1;
  
  PVar1 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0061,false);
  return PVar1 + ~REQUIRED_ALWAYS < 0xfffffffd;
}

Assistant:

bool cmMakefile::IgnoreErrorsCMP0061() const
{
  bool ignoreErrors = true;
  switch (this->GetPolicyStatus(cmPolicies::CMP0061)) {
    case cmPolicies::WARN:
      // No warning for this policy!
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      ignoreErrors = false;
      break;
  }
  return ignoreErrors;
}